

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * actionName(u8 action)

{
  if ((byte)(action - 7) < 4) {
    return &DAT_001eae80 + *(int *)(&DAT_001eae80 + (ulong)(byte)(action - 7) * 4);
  }
  return "NO ACTION";
}

Assistant:

static const char *actionName(u8 action){
  const char *zName;
  switch( action ){
    case OE_SetNull:  zName = "SET NULL";        break;
    case OE_SetDflt:  zName = "SET DEFAULT";     break;
    case OE_Cascade:  zName = "CASCADE";         break;
    case OE_Restrict: zName = "RESTRICT";        break;
    default:          zName = "NO ACTION";
                      assert( action==OE_None ); break;
  }
  return zName;
}